

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqReqRep.cpp
# Opt level: O0

void __thiscall adios2::zmq::ZmqReqRep::ZmqReqRep(ZmqReqRep *this)

{
  undefined8 uVar1;
  long in_RDI;
  allocator local_b1;
  string local_b0 [4];
  int in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  string local_88 [39];
  allocator local_61;
  string local_60 [39];
  allocator local_39;
  string local_38 [56];
  
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0xdb9cea);
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  uVar1 = zmq_ctx_new();
  *(undefined8 *)(in_RDI + 0x20) = uVar1;
  if (*(long *)(in_RDI + 0x20) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Toolkit",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"ZmqReqRep",&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"ZmqReqRep",(allocator *)&stack0xffffffffffffff77);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"creating zmq context failed",&local_b1);
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

ZmqReqRep::ZmqReqRep()
{
    m_Context = zmq_ctx_new();
    if (not m_Context)
    {
        helper::Throw<std::runtime_error>("Toolkit", "ZmqReqRep", "ZmqReqRep",
                                          "creating zmq context failed");
    }
}